

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O2

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab)

{
  int32_t *piVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this;
  int iVar2;
  uint uVar3;
  mapped_type pgVar4;
  pointer pgVar5;
  void *pvVar6;
  void *__src;
  FILE *__stream;
  int32_t iVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  int iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ggml_context *pgVar21;
  ggml_tensor *pgVar22;
  mapped_type *ppgVar23;
  undefined8 uVar24;
  iterator iVar25;
  size_t __n;
  undefined8 uVar26;
  long lVar27;
  ulong uVar28;
  pointer pcVar29;
  bool bVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  char *pcVar34;
  long lVar35;
  vector<char,_std::allocator<char>_> *pvVar36;
  int i;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int32_t length;
  uint32_t magic;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  uint32_t len;
  vector<char,_std::allocator<char>_> buf;
  gpt2_hparams *hparams;
  int32_t n_vocab;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  ifstream fin;
  byte abStack_218 [488];
  
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p);
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    std::istream::read((char *)&fin,(long)&magic);
    if (magic == 0x67676d6c) {
      std::istream::read((char *)&fin,(long)model);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_ctx);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_embd);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_head);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_layer);
      piVar1 = &(model->hparams).ftype;
      std::istream::read((char *)&fin,(long)piVar1);
      iVar10 = (model->hparams).ftype;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_vocab);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_ctx);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_embd);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_head);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_layer);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).ftype);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(long)iVar10 / 1000 & 0xffffffff);
      (model->hparams).ftype = (model->hparams).ftype % 1000;
      n_vocab = 0;
      std::istream::read((char *)&fin,(long)&n_vocab);
      if (n_vocab == (model->hparams).n_vocab) {
        _magic = (pointer)&local_318;
        local_320 = 0;
        local_318._M_local_buf[0] = '\0';
        std::vector<char,_std::allocator<char>_>::vector(&buf,0x80,(allocator_type *)&length);
        for (length = 0; length < n_vocab; length = length + 1) {
          std::istream::read((char *)&fin,(long)&len);
          std::vector<char,_std::allocator<char>_>::resize(&buf,(ulong)len);
          std::istream::read((char *)&fin,
                             (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
          std::__cxx11::string::assign
                    ((char *)&magic,
                     (ulong)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
          iVar7 = length;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&vocab->token_to_id,(key_type *)&magic);
          *pmVar11 = iVar7;
          pmVar12 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&vocab->id_to_token,&length);
          std::__cxx11::string::_M_assign((string *)pmVar12);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&buf.super__Vector_base<char,_std::allocator<char>_>);
        std::__cxx11::string::~string((string *)&magic);
        iVar10 = ggml_ftype_to_ggml_type(*piVar1);
        if (iVar10 == 0x27) {
          bVar30 = false;
          fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                  (fname->_M_dataplus)._M_p,(ulong)(uint)*piVar1);
        }
        else {
          iVar33 = (model->hparams).n_embd;
          lVar35 = (long)iVar33;
          iVar2 = (model->hparams).n_layer;
          lVar27 = (long)(model->hparams).n_ctx;
          iVar31 = (model->hparams).n_vocab;
          lVar13 = ggml_row_size(0,lVar35);
          lVar14 = ggml_row_size(0,lVar35);
          lVar37 = iVar31 * lVar35;
          lVar15 = ggml_row_size(iVar10,lVar37);
          lVar16 = ggml_row_size(0,lVar27 * lVar35);
          lVar37 = ggml_row_size(iVar10,lVar37);
          local_258 = ggml_row_size(0,lVar35);
          local_260 = ggml_row_size(0,lVar35);
          lVar17 = ggml_row_size(0,lVar35);
          local_268 = ggml_row_size(0,lVar35);
          local_270 = ggml_row_size(iVar10,(long)((int)(lVar35 * 3) * iVar33));
          local_278 = ggml_row_size(0,lVar35 * 3);
          local_280 = ggml_row_size(iVar10,iVar33 * iVar33);
          local_288 = ggml_row_size(0,lVar35);
          iVar31 = iVar33 * 4;
          lVar18 = ggml_row_size(iVar10,(long)(iVar31 * iVar33));
          local_290 = ggml_row_size(0,(long)iVar31);
          lVar19 = ggml_row_size(iVar10,(long)(iVar31 * iVar33));
          lVar20 = ggml_row_size(0,(long)iVar31);
          local_298 = ggml_row_size(0,lVar35);
          lVar35 = ggml_row_size(0,lVar35);
          lVar13 = lVar16 + lVar37 + lVar13 + lVar14 + lVar15 + (long)(iVar2 * 0x1800 + 0xc00) +
                   (lVar35 + local_298) * lVar27 * iVar2 +
                   (lVar19 + lVar20 +
                   lVar18 + local_290 +
                   lVar17 + local_268 + local_260 + local_258 + local_278 + local_280 + local_288 +
                   local_270) * (long)iVar2;
          printf("%s: ggml tensor size = %d bytes\n","gpt2_model_load",0x150);
          auVar38._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar38._0_8_ = lVar13;
          auVar38._12_4_ = 0x45300000;
          printf("%s: ggml ctx size = %6.2f MB\n",
                 ((auVar38._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) *
                 9.5367431640625e-07,"gpt2_model_load");
          uStack_248 = 0;
          local_240 = 0;
          uVar26 = 0;
          local_250 = lVar13;
          pgVar21 = (ggml_context *)ggml_init();
          model->ctx_w = pgVar21;
          if (pgVar21 == (ggml_context *)0x0) {
            bVar30 = false;
            fprintf(_stderr,"%s: ggml_init() failed\n","gpt2_model_load");
          }
          else {
            iVar33 = (model->hparams).n_embd;
            lVar15 = (long)iVar33;
            uVar3 = (model->hparams).n_layer;
            iVar2 = (model->hparams).n_ctx;
            lVar14 = (long)(model->hparams).n_vocab;
            std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                      (&model->layers,(long)(int)uVar3);
            pgVar22 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar15);
            model->ln_f_g = pgVar22;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar15);
            model->ln_f_b = pgVar22;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar10,lVar15,lVar14);
            model->wte = pgVar22;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,0,lVar15,(long)iVar2);
            model->wpe = pgVar22;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar10,lVar15,lVar14);
            model->lm_head = pgVar22;
            pgVar4 = model->ln_f_g;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&magic,"model/ln_f/g",(allocator<char> *)&buf);
            this = &model->tensors;
            ppgVar23 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&magic);
            *ppgVar23 = pgVar4;
            std::__cxx11::string::~string((string *)&magic);
            pgVar4 = model->ln_f_b;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&magic,"model/ln_f/b",(allocator<char> *)&buf);
            ppgVar23 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&magic);
            *ppgVar23 = pgVar4;
            std::__cxx11::string::~string((string *)&magic);
            pgVar4 = model->wte;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&magic,"model/wte",(allocator<char> *)&buf);
            ppgVar23 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&magic);
            *ppgVar23 = pgVar4;
            std::__cxx11::string::~string((string *)&magic);
            pgVar4 = model->wpe;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&magic,"model/wpe",(allocator<char> *)&buf);
            ppgVar23 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&magic);
            *ppgVar23 = pgVar4;
            std::__cxx11::string::~string((string *)&magic);
            pgVar4 = model->lm_head;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&magic,"model/lm_head",(allocator<char> *)&buf);
            ppgVar23 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&magic);
            *ppgVar23 = pgVar4;
            std::__cxx11::string::~string((string *)&magic);
            lVar14 = (long)(iVar33 * 4);
            uVar28 = 0;
            uVar32 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar32 = uVar28;
            }
            lVar16 = 0x58;
            for (; uVar32 != uVar28; uVar28 = uVar28 + 1) {
              pgVar5 = (model->layers).super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x58) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x50) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x48) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x40) = uVar24;
              uVar24 = ggml_new_tensor_2d(model->ctx_w,iVar10,lVar15,lVar15 * 3);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x38) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15 * 3);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x30) = uVar24;
              uVar24 = ggml_new_tensor_2d(model->ctx_w,iVar10,lVar15,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x28) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x20) = uVar24;
              uVar24 = ggml_new_tensor_2d(model->ctx_w,iVar10,lVar15,lVar14);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x18) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar14);
              *(undefined8 *)((long)pgVar5 + lVar16 + -0x10) = uVar24;
              uVar24 = ggml_new_tensor_2d(model->ctx_w,iVar10,lVar14,lVar15);
              *(undefined8 *)((long)pgVar5 + lVar16 + -8) = uVar24;
              uVar24 = ggml_new_tensor_1d(model->ctx_w,0,lVar15);
              *(undefined8 *)((long)&pgVar5->ln_1_g + lVar16) = uVar24;
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x58);
              iVar33 = (int)uVar28;
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/ln_1/g");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x50);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/ln_1/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x48);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/ln_2/g");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x40);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/ln_2/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x38);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/attn/c_attn/w");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x30);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/attn/c_attn/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x28);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/attn/c_proj/w");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x20);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/attn/c_proj/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x18);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/mlp/c_fc/w");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -0x10);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/mlp/c_fc/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar16 + -8);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/mlp/c_proj/w");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)&pgVar5->ln_1_g + lVar16);
              std::__cxx11::to_string((string *)&n_vocab,iVar33);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &buf,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&buf,"/mlp/c_proj/b");
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&magic);
              *ppgVar23 = pgVar4;
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&buf);
              std::__cxx11::string::~string((string *)&n_vocab);
              lVar16 = lVar16 + 0x60;
            }
            uVar32 = (long)(model->hparams).n_ctx * (long)(model->hparams).n_layer;
            lVar14 = (long)(model->hparams).n_embd * uVar32;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar14);
            model->memory_k = pgVar22;
            pgVar22 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar14);
            model->memory_v = pgVar22;
            lVar14 = ggml_nbytes(model->memory_k);
            lVar15 = ggml_nbytes(model->memory_v);
            lVar15 = lVar15 + lVar14;
            auVar39._8_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar39._0_8_ = lVar15;
            auVar39._12_4_ = 0x45300000;
            printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                   ((auVar39._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,"gpt2_model_load",uVar32 & 0xffffffff);
            lVar14 = 0;
            bVar30 = false;
            while( true ) {
              iVar10 = 1;
              pvVar36 = &buf;
              std::istream::read((char *)&fin,(long)&n_vocab);
              std::istream::read((char *)&fin,(long)&length);
              std::istream::read((char *)&fin,(long)&len);
              if ((abStack_218[*(long *)(_fin + -0x18)] & 2) != 0) break;
              buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x100000001;
              for (lVar15 = 0; lVar15 < n_vocab; lVar15 = lVar15 + 1) {
                std::istream::read((char *)&fin,(long)pvVar36);
                iVar10 = iVar10 * *(int *)&(pvVar36->super__Vector_base<char,_std::allocator<char>_>
                                           )._M_impl.super__Vector_impl_data._M_start;
                pvVar36 = (vector<char,_std::allocator<char>_> *)
                          ((long)&(pvVar36->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                  .super__Vector_impl_data._M_start + 4);
              }
              _magic = (pointer)&local_318;
              std::__cxx11::string::_M_construct((ulong)&magic,(char)length);
              std::istream::read((char *)&fin,(long)_magic);
              iVar25 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::find(&this->_M_t,(key_type *)&magic);
              if ((_Rb_tree_header *)iVar25._M_node ==
                  &(model->tensors)._M_t._M_impl.super__Rb_tree_header) {
                pcVar34 = "%s: unknown tensor \'%s\' in model file\n";
LAB_00109048:
                fprintf(_stderr,pcVar34,"gpt2_model_load",_magic);
LAB_001090bd:
                std::__cxx11::string::~string((string *)&magic);
                bVar30 = false;
                goto LAB_00108f29;
              }
              ppgVar23 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(key_type *)&magic);
              pgVar4 = *ppgVar23;
              lVar15 = ggml_nelements(pgVar4);
              if (lVar15 != iVar10) {
                pcVar34 = "%s: tensor \'%s\' has wrong size in model file\n";
                goto LAB_00109048;
              }
              if ((pgVar4->ne[0] !=
                   (long)(int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start) ||
                 (pgVar4->ne[1] !=
                  (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_)) {
                fprintf(_stderr,
                        "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                        ,"gpt2_model_load",_magic,pgVar4->ne[0],pgVar4->ne[1],
                        CONCAT44((int)((ulong)lVar13 >> 0x20),
                                 (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start),
                        CONCAT44((int)((ulong)uVar26 >> 0x20),
                                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_));
                goto LAB_001090bd;
              }
              lVar16 = ggml_type_size(len);
              uVar32 = ggml_blck_size(pgVar4->type);
              uVar28 = ggml_nbytes(pgVar4);
              _Var8._M_p = _magic;
              __stream = _stderr;
              if ((ulong)(lVar16 * lVar15) / uVar32 != uVar28) {
                uVar26 = ggml_nbytes(pgVar4);
                fprintf(__stream,
                        "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                        "gpt2_model_load",_Var8._M_p,uVar26,lVar16 * lVar15);
                goto LAB_001090bd;
              }
              pvVar6 = pgVar4->data;
              ggml_nbytes(pgVar4);
              std::istream::read((char *)&fin,(long)pvVar6);
              bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"model/wte");
              if ((bVar9) && (!bVar30)) {
                pvVar6 = model->lm_head->data;
                __src = pgVar4->data;
                __n = ggml_nbytes(pgVar4);
                memcpy(pvVar6,__src,__n);
              }
              bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"model/lm_head");
              lVar15 = ggml_nbytes(pgVar4);
              if (bVar9) {
                bVar30 = true;
              }
              lVar14 = lVar14 + lVar15;
              std::__cxx11::string::~string((string *)&magic);
            }
            auVar40._8_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar40._0_8_ = lVar14;
            auVar40._12_4_ = 0x45300000;
            bVar30 = true;
            printf("%s: model size  = %8.2f MB\n",
                   ((auVar40._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,"gpt2_model_load");
            std::ifstream::close();
          }
        }
      }
      else {
        bVar30 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n",
                "gpt2_model_load",(fname->_M_dataplus)._M_p);
      }
      goto LAB_00108f29;
    }
    pcVar29 = (fname->_M_dataplus)._M_p;
    pcVar34 = "%s: invalid model file \'%s\' (bad magic)\n";
  }
  else {
    pcVar29 = (fname->_M_dataplus)._M_p;
    pcVar34 = "%s: failed to open \'%s\'\n";
  }
  bVar30 = false;
  fprintf(_stderr,pcVar34,"gpt2_model_load",pcVar29);
LAB_00108f29:
  std::ifstream::~ifstream(&fin);
  return bVar30;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        ctx_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        ctx_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        ctx_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_k
        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_v

        ctx_size += (6 + 12*n_layer)*512; // object overhead

        printf("%s: ggml tensor size = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                memcpy(model.lm_head->data, tensor->data, ggml_nbytes(tensor));
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}